

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype t0,sunrealtype tf)

{
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  MRIStepInnerStepper p_Var3;
  int *piVar4;
  MRIStepCoupling pMVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  sunrealtype ***pppsVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  
  iVar10 = step_mem->explicit_rhs;
  iVar6 = step_mem->implicit_rhs;
  psVar1 = step_mem->cvals;
  pp_Var2 = step_mem->Xvecs;
  p_Var3 = step_mem->stepper;
  p_Var3->tshift = t0;
  p_Var3->tscale = tf - t0;
  bVar14 = step_mem->MRIC->type == MRISTEP_SR;
  if (bVar14) {
    iVar6 = 0;
  }
  iVar13 = 1;
  if (!bVar14) {
    iVar13 = iVar10;
  }
  uVar9 = step_mem->stages;
  if (stage <= step_mem->stages) {
    uVar9 = stage;
  }
  if (0 < (int)uVar9) {
    uVar8 = 0;
    iVar10 = 0;
    do {
      if ((iVar13 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        pp_Var2[iVar10] = step_mem->Fse[step_mem->stage_map[uVar8]];
        iVar10 = iVar10 + 1;
      }
      if ((iVar6 != 0) && (-1 < (long)step_mem->stage_map[uVar8])) {
        pp_Var2[iVar10] = step_mem->Fsi[step_mem->stage_map[uVar8]];
        iVar10 = iVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  lVar7 = (long)step_mem->MRIC->nmat;
  if (0 < lVar7) {
    dVar15 = ark_mem->h / (tf - t0);
    lVar12 = 0;
    do {
      uVar9 = step_mem->stages;
      if (stage <= step_mem->stages) {
        uVar9 = stage;
      }
      iVar10 = 0;
      if (0 < (int)uVar9) {
        piVar4 = step_mem->stage_map;
        uVar8 = 0;
        iVar10 = 0;
        do {
          if (-1 < piVar4[uVar8]) {
            pMVar5 = step_mem->MRIC;
            if (iVar6 == 0 || iVar13 == 0) {
              if (iVar13 == 0) {
                pppsVar11 = pMVar5->G;
              }
              else {
                pppsVar11 = pMVar5->W;
              }
              psVar1[iVar10] = pppsVar11[lVar12][stage][uVar8] * dVar15;
              iVar10 = iVar10 + 1;
            }
            else {
              psVar1[iVar10] = pMVar5->W[lVar12][stage][uVar8] * dVar15;
              psVar1[(long)iVar10 + 1] = pMVar5->G[lVar12][stage][uVar8] * dVar15;
              iVar10 = iVar10 + 2;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      iVar10 = N_VLinearCombination(iVar10,psVar1,pp_Var2,step_mem->stepper->forcing[lVar12]);
      if (iVar10 != 0) {
        return -0x1c;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar7);
  }
  return 0;
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype t0, sunrealtype tf)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  sunbooleantype implicit_rhs = step_mem->implicit_rhs;
  sunbooleantype explicit_rhs = step_mem->explicit_rhs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Set inner forcing time normalization constants */
  step_mem->stepper->tshift = t0;
  step_mem->stepper->tscale = tf - t0;

  /* Adjust implicit/explicit RHS flags for MRISR methods, since these
     ignore the G coefficients in the forcing function */
  if (step_mem->MRIC->type == MRISTEP_SR)
  {
    implicit_rhs = SUNFALSE;
    explicit_rhs = SUNTRUE;
  }

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < SUNMIN(stage, step_mem->stages); j++)
  {
    if (explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ark_mem->h / (tf - t0);

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < SUNMIN(stage, step_mem->stages); j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (explicit_rhs && implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  SUNLogExtraDebugVecArray(ARK_LOGGER, "forcing", nmat,
                           step_mem->stepper->forcing, "forcing_%i(:) =");

  return (ARK_SUCCESS);
}